

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VisMF.cpp
# Opt level: O0

void amrex::VisMF::FindOffsets
               (FabArray<amrex::FArrayBox> *mf,string *filePrefix,Header *hdr,Version param_4,
               NFilesIter *nfi,MPI_Comm comm)

{
  FABio *pFVar1;
  bool bVar2;
  Format FVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  Long LVar7;
  streamoff sVar8;
  long *plVar9;
  int *piVar10;
  string *filename;
  iterator this;
  pointer ppVar11;
  FabOnDisk *pFVar12;
  int *in_RDX;
  FabArrayBase *in_RDI;
  NFilesIter *in_R8;
  MPI_Comm in_R9D;
  undefined1 auVar13 [16];
  int i_4;
  Vector<int,_std::allocator<int>_> *index;
  iterator rboIter;
  int rank;
  int ri;
  int fn;
  Vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
  *fileNumbersWriteOrder;
  int i_3;
  int i_2;
  Vector<int,_std::allocator<int>_> fileNumbers;
  int i_1;
  map<int,_amrex::Vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Vector<int,_std::allocator<int>_>_>_>_>
  rankBoxOrder;
  FArrayBox tempFab;
  stringstream hss;
  int i;
  Vector<long,_std::allocator<long>_> currentOffset;
  string whichFileName;
  int whichFileNumber;
  int nFiles;
  Vector<long,_std::allocator<long>_> fabHeaderBytes;
  DistributionMapping *mfDM;
  BoxArray *mfBA;
  int nComps;
  int whichRDBytes;
  FABio *fio;
  unique_ptr<amrex::RealDescriptor,_std::default_delete<amrex::RealDescriptor>_> whichRD;
  int coordinatorProc;
  int nProcs;
  int myProc;
  Arena *in_stack_fffffffffffffb28;
  string *in_stack_fffffffffffffb30;
  FabArrayBase *in_stack_fffffffffffffb38;
  Box *in_stack_fffffffffffffb40;
  size_type in_stack_fffffffffffffb48;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffb50;
  undefined8 in_stack_fffffffffffffb58;
  FabArrayBase *in_stack_fffffffffffffb60;
  key_type *in_stack_fffffffffffffb68;
  map<int,_amrex::Vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Vector<int,_std::allocator<int>_>_>_>_>
  *in_stack_fffffffffffffb70;
  undefined4 in_stack_fffffffffffffb88;
  undefined2 in_stack_fffffffffffffb8c;
  undefined1 in_stack_fffffffffffffb8e;
  int local_3cc;
  string local_3c8 [32];
  string local_3a8 [32];
  Vector<int,_std::allocator<int>_> *local_388;
  _Self local_380;
  _Self local_378;
  int local_36c;
  int local_368;
  int local_364;
  Vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
  *local_360;
  int local_358;
  int local_354;
  int local_320;
  int local_31c;
  undefined1 local_2e8 [3] [16];
  BaseFab<double> local_2b8;
  stringstream local_270 [16];
  undefined1 local_260 [376];
  int local_e8;
  undefined8 local_e0;
  string local_c0 [36];
  int local_9c;
  int local_98;
  undefined8 local_90;
  DistributionMapping *local_70;
  BoxArray *local_68;
  int local_5c;
  int local_58;
  FABio *local_48;
  int local_38;
  int local_34;
  int local_30;
  MPI_Comm local_2c;
  NFilesIter *local_28;
  int *local_18;
  FabArrayBase *local_8;
  
  local_2c = in_R9D;
  local_28 = in_R8;
  local_18 = in_RDX;
  local_8 = in_RDI;
  local_30 = ParallelDescriptor::MyProc(in_R9D);
  local_34 = ParallelDescriptor::NProcs(local_2c);
  local_38 = ParallelDescriptor::IOProcessorNumber
                       ((MPI_Comm)((ulong)in_stack_fffffffffffffb30 >> 0x20));
  bVar2 = NFilesIter::GetDynamic(local_28);
  if (bVar2) {
    local_38 = NFilesIter::CoordinatorProc(local_28);
  }
  FVar3 = FArrayBox::getFormat();
  if ((FVar3 != FAB_ASCII) && (FVar3 = FArrayBox::getFormat(), FVar3 != FAB_8BIT)) {
    FArrayBox::getDataDescriptor();
    local_48 = FArrayBox::getFABio();
    std::unique_ptr<amrex::RealDescriptor,_std::default_delete<amrex::RealDescriptor>_>::operator->
              ((unique_ptr<amrex::RealDescriptor,_std::default_delete<amrex::RealDescriptor>_> *)
               0xf7fbe8);
    local_58 = RealDescriptor::numBytes((RealDescriptor *)0xf7fbf0);
    local_5c = FabArrayBase::nComp(local_8);
    if (local_30 == local_38) {
      local_68 = FabArrayBase::boxArray(local_8);
      local_70 = FabArrayBase::DistributionMap(local_8);
      BoxArray::size((BoxArray *)0xf7fc66);
      local_90 = 0;
      std::allocator<long>::allocator((allocator<long> *)0xf7fc8f);
      Vector<long,_std::allocator<long>_>::vector
                ((Vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffb40,
                 (size_type)in_stack_fffffffffffffb38,
                 (value_type_conflict2 *)in_stack_fffffffffffffb30,
                 (allocator_type *)in_stack_fffffffffffffb28);
      std::allocator<long>::~allocator((allocator<long> *)0xf7fcc3);
      local_98 = NFilesIter::ActualNFiles((int)((ulong)in_stack_fffffffffffffb30 >> 0x20));
      local_9c = -1;
      std::__cxx11::string::string(local_c0);
      local_e0 = 0;
      std::allocator<long>::allocator((allocator<long> *)0xf7fd2e);
      Vector<long,_std::allocator<long>_>::vector
                ((Vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffb40,
                 (size_type)in_stack_fffffffffffffb38,
                 (value_type_conflict2 *)in_stack_fffffffffffffb30,
                 (allocator_type *)in_stack_fffffffffffffb28);
      std::allocator<long>::~allocator((allocator<long> *)0xf7fd62);
      if (*local_18 == 1) {
        local_e8 = 0;
        while( true ) {
          lVar6 = (long)local_e8;
          LVar7 = BoxArray::size((BoxArray *)0xf7fd9b);
          if (LVar7 <= lVar6) break;
          std::__cxx11::stringstream::stringstream(local_270);
          FabArrayBase::fabbox
                    (in_stack_fffffffffffffb60,(int)((ulong)in_stack_fffffffffffffb58 >> 0x20));
          FArrayBox::FArrayBox
                    ((FArrayBox *)in_stack_fffffffffffffb40,(Box *)in_stack_fffffffffffffb38,
                     (int)((ulong)in_stack_fffffffffffffb30 >> 0x20),
                     SUB81((ulong)in_stack_fffffffffffffb30 >> 0x18,0),
                     SUB81((ulong)in_stack_fffffffffffffb30 >> 0x10,0),in_stack_fffffffffffffb28);
          pFVar1 = local_48;
          uVar4 = BaseFab<double>::nComp(&local_2b8);
          (*pFVar1->_vptr_FABio[6])(pFVar1,local_260,&local_2b8,(ulong)uVar4);
          auVar13 = std::ostream::tellp();
          local_2e8[0] = auVar13;
          sVar8 = std::fpos::operator_cast_to_long((fpos *)local_2e8);
          plVar9 = Vector<long,_std::allocator<long>_>::operator[]
                             ((Vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffb30,
                              (size_type)in_stack_fffffffffffffb28);
          *plVar9 = sVar8;
          FArrayBox::~FArrayBox((FArrayBox *)0xf7fee0);
          std::__cxx11::stringstream::~stringstream(local_270);
          local_e8 = local_e8 + 1;
        }
      }
      std::
      map<int,_amrex::Vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Vector<int,_std::allocator<int>_>_>_>_>
      ::map((map<int,_amrex::Vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Vector<int,_std::allocator<int>_>_>_>_>
             *)0xf7fff2);
      local_31c = 0;
      while( true ) {
        lVar6 = (long)local_31c;
        LVar7 = BoxArray::size((BoxArray *)0xf80017);
        if (LVar7 <= lVar6) break;
        local_320 = DistributionMapping::operator[]
                              ((DistributionMapping *)in_stack_fffffffffffffb30,
                               (int)((ulong)in_stack_fffffffffffffb28 >> 0x20));
        std::
        map<int,_amrex::Vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Vector<int,_std::allocator<int>_>_>_>_>
        ::operator[](in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb40,
                   (value_type *)in_stack_fffffffffffffb38);
        local_31c = local_31c + 1;
      }
      Vector<int,_std::allocator<int>_>::Vector((Vector<int,_std::allocator<int>_> *)0xf800ad);
      bVar2 = NFilesIter::GetDynamic(local_28);
      if (bVar2) {
        NFilesIter::FileNumbersWritten
                  ((NFilesIter *)
                   CONCAT17(bVar2,CONCAT16(in_stack_fffffffffffffb8e,
                                           CONCAT24(in_stack_fffffffffffffb8c,
                                                    in_stack_fffffffffffffb88))));
        Vector<int,_std::allocator<int>_>::operator=
                  ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb30,
                   (Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb28);
        Vector<int,_std::allocator<int>_>::~Vector((Vector<int,_std::allocator<int>_> *)0xf80103);
      }
      else {
        bVar2 = NFilesIter::GetSparseFPP(local_28);
        if (bVar2) {
          std::vector<int,_std::allocator<int>_>::resize
                    (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
          for (local_354 = 0; local_354 < local_34; local_354 = local_354 + 1) {
            iVar5 = local_354;
            piVar10 = Vector<int,_std::allocator<int>_>::operator[]
                                ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb30,
                                 (size_type)in_stack_fffffffffffffb28);
            *piVar10 = iVar5;
          }
        }
        else {
          std::vector<int,_std::allocator<int>_>::resize
                    (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
          for (local_358 = 0; local_358 < local_34; local_358 = local_358 + 1) {
            iVar5 = NFilesIter::FileNumber
                              ((int)in_stack_fffffffffffffb40,
                               (int)((ulong)in_stack_fffffffffffffb38 >> 0x20),
                               SUB81((ulong)in_stack_fffffffffffffb38 >> 0x18,0));
            piVar10 = Vector<int,_std::allocator<int>_>::operator[]
                                ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb30,
                                 (size_type)in_stack_fffffffffffffb28);
            *piVar10 = iVar5;
          }
        }
      }
      local_360 = NFilesIter::FileNumbersWriteOrder(local_28);
      local_364 = 0;
      while( true ) {
        lVar6 = (long)local_364;
        LVar7 = Vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
                ::size((Vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
                        *)0xf8027b);
        if (LVar7 <= lVar6) break;
        local_368 = 0;
        while( true ) {
          filename = (string *)(long)local_368;
          Vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
          ::operator[]((Vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
                        *)in_stack_fffffffffffffb30,(size_type)in_stack_fffffffffffffb28);
          LVar7 = Vector<int,_std::allocator<int>_>::size
                            ((Vector<int,_std::allocator<int>_> *)0xf802c1);
          if (LVar7 <= (long)filename) break;
          Vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
          ::operator[]((Vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
                        *)in_stack_fffffffffffffb30,(size_type)in_stack_fffffffffffffb28);
          piVar10 = Vector<int,_std::allocator<int>_>::operator[]
                              ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb30,
                               (size_type)in_stack_fffffffffffffb28);
          local_36c = *piVar10;
          this = std::
                 map<int,_amrex::Vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Vector<int,_std::allocator<int>_>_>_>_>
                 ::find((map<int,_amrex::Vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Vector<int,_std::allocator<int>_>_>_>_>
                         *)in_stack_fffffffffffffb28,(key_type *)0xf80315);
          local_378._M_node = this._M_node;
          local_380._M_node =
               (_Base_ptr)
               std::
               map<int,_amrex::Vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Vector<int,_std::allocator<int>_>_>_>_>
               ::end((map<int,_amrex::Vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Vector<int,_std::allocator<int>_>_>_>_>
                      *)in_stack_fffffffffffffb28);
          bVar2 = std::operator!=(&local_378,&local_380);
          if (bVar2) {
            ppVar11 = std::
                      _Rb_tree_iterator<std::pair<const_int,_amrex::Vector<int,_std::allocator<int>_>_>_>
                      ::operator->((_Rb_tree_iterator<std::pair<const_int,_amrex::Vector<int,_std::allocator<int>_>_>_>
                                    *)0xf80369);
            local_388 = &ppVar11->second;
            piVar10 = Vector<int,_std::allocator<int>_>::operator[]
                                ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb30,
                                 (size_type)in_stack_fffffffffffffb28);
            local_9c = *piVar10;
            NFilesIter::FileName
                      ((int)((ulong)in_stack_fffffffffffffb38 >> 0x20),in_stack_fffffffffffffb30);
            BaseName(filename);
            std::__cxx11::string::operator=(local_c0,local_3a8);
            std::__cxx11::string::~string(local_3a8);
            std::__cxx11::string::~string(local_3c8);
            local_3cc = 0;
            while( true ) {
              lVar6 = (long)local_3cc;
              LVar7 = Vector<int,_std::allocator<int>_>::size
                                ((Vector<int,_std::allocator<int>_> *)0xf8041c);
              if (LVar7 <= lVar6) break;
              Vector<int,_std::allocator<int>_>::operator[]
                        ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb30,
                         (size_type)in_stack_fffffffffffffb28);
              iVar5 = (int)((ulong)lVar6 >> 0x20);
              pFVar12 = Vector<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>::
                        operator[]((Vector<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>
                                    *)in_stack_fffffffffffffb30,(size_type)in_stack_fffffffffffffb28
                                  );
              std::__cxx11::string::operator=((string *)pFVar12,local_c0);
              plVar9 = Vector<long,_std::allocator<long>_>::operator[]
                                 ((Vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffb30,
                                  (size_type)in_stack_fffffffffffffb28);
              in_stack_fffffffffffffb30 = (string *)*plVar9;
              in_stack_fffffffffffffb28 = (Arena *)(local_18 + 0x20);
              Vector<int,_std::allocator<int>_>::operator[]
                        ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb30,
                         (size_type)in_stack_fffffffffffffb28);
              pFVar12 = Vector<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>::
                        operator[]((Vector<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>
                                    *)in_stack_fffffffffffffb30,(size_type)in_stack_fffffffffffffb28
                                  );
              pFVar12->m_head = (Long)in_stack_fffffffffffffb30;
              in_stack_fffffffffffffb38 = local_8;
              Vector<int,_std::allocator<int>_>::operator[]
                        ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb30,
                         (size_type)in_stack_fffffffffffffb28);
              FabArrayBase::fabbox((FabArrayBase *)this._M_node,iVar5);
              LVar7 = Box::numPts(in_stack_fffffffffffffb40);
              in_stack_fffffffffffffb40 = (Box *)(LVar7 * local_5c * (long)local_58);
              Vector<int,_std::allocator<int>_>::operator[]
                        ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb30,
                         (size_type)in_stack_fffffffffffffb28);
              plVar9 = Vector<long,_std::allocator<long>_>::operator[]
                                 ((Vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffb30,
                                  (size_type)in_stack_fffffffffffffb28);
              lVar6 = (long)(&(((BaseFab<double> *)&in_stack_fffffffffffffb40->smallend)->domain).
                              smallend + -2) + *plVar9;
              plVar9 = Vector<long,_std::allocator<long>_>::operator[]
                                 ((Vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffb30,
                                  (size_type)in_stack_fffffffffffffb28);
              *plVar9 = lVar6 + *plVar9;
              local_3cc = local_3cc + 1;
            }
          }
          local_368 = local_368 + 1;
        }
        local_364 = local_364 + 1;
      }
      Vector<int,_std::allocator<int>_>::~Vector((Vector<int,_std::allocator<int>_> *)0xf805f8);
      std::
      map<int,_amrex::Vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Vector<int,_std::allocator<int>_>_>_>_>
      ::~map((map<int,_amrex::Vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Vector<int,_std::allocator<int>_>_>_>_>
              *)0xf80605);
      Vector<long,_std::allocator<long>_>::~Vector((Vector<long,_std::allocator<long>_> *)0xf80612);
      std::__cxx11::string::~string(local_c0);
      Vector<long,_std::allocator<long>_>::~Vector((Vector<long,_std::allocator<long>_> *)0xf8062c);
    }
    std::unique_ptr<amrex::RealDescriptor,_std::default_delete<amrex::RealDescriptor>_>::~unique_ptr
              ((unique_ptr<amrex::RealDescriptor,_std::default_delete<amrex::RealDescriptor>_> *)
               in_stack_fffffffffffffb40);
  }
  return;
}

Assistant:

void
VisMF::FindOffsets (const FabArray<FArrayBox> &mf,
                    const std::string &filePrefix,
                    VisMF::Header &hdr,
                    VisMF::Header::Version /*whichVersion*/,
                    NFilesIter &nfi, MPI_Comm comm)
{
//    BL_PROFILE("VisMF::FindOffsets");

    const int myProc(ParallelDescriptor::MyProc(comm));
    const int nProcs(ParallelDescriptor::NProcs(comm));
    int coordinatorProc(ParallelDescriptor::IOProcessorNumber(comm));
    if(nfi.GetDynamic()) {
      coordinatorProc = nfi.CoordinatorProc();
    }

    if(FArrayBox::getFormat() == FABio::FAB_ASCII ||
       FArrayBox::getFormat() == FABio::FAB_8BIT)
    {

#ifdef BL_USE_MPI
    Vector<int> nmtags(nProcs,0);
    Vector<int> offset(nProcs,0);

    const Vector<int> &pmap = mf.DistributionMap().ProcessorMap();

    for(int i(0), N(mf.size()); i < N; ++i) {
        ++nmtags[pmap[i]];
    }

    for(int i(1), N(offset.size()); i < N; ++i) {
        offset[i] = offset[i-1] + nmtags[i-1];
    }

    Vector<Long> senddata(nmtags[myProc]);

    if(senddata.empty()) {
      // Can't let senddata be empty as senddata.dataPtr() will fail.
      senddata.resize(1);
    }

    int ioffset(0);

    for(MFIter mfi(mf); mfi.isValid(); ++mfi) {
      senddata[ioffset++] = hdr.m_fod[mfi.index()].m_head;
    }

    BL_ASSERT(ioffset == nmtags[myProc]);

    Vector<Long> recvdata(mf.size());

    BL_COMM_PROFILE(BLProfiler::Gatherv, recvdata.size() * sizeof(Long),
                    myProc, BLProfiler::BeforeCall());

    BL_MPI_REQUIRE( MPI_Gatherv(senddata.dataPtr(),
                                nmtags[myProc],
                                ParallelDescriptor::Mpi_typemap<Long>::type(),
                                recvdata.dataPtr(),
                                nmtags.dataPtr(),
                                offset.dataPtr(),
                                ParallelDescriptor::Mpi_typemap<Long>::type(),
                                coordinatorProc,
                                comm) );

    BL_COMM_PROFILE(BLProfiler::Gatherv, recvdata.size() * sizeof(Long),
                    myProc, BLProfiler::AfterCall());

    if(myProc == coordinatorProc) {
        Vector<int> cnt(nProcs,0);

        for(int j(0), N(mf.size()); j < N; ++j) {
            const int i(pmap[j]);
            hdr.m_fod[j].m_head = recvdata[offset[i]+cnt[i]];

            const std::string name(NFilesIter::FileName(nOutFiles, filePrefix, i, groupSets));

            hdr.m_fod[j].m_name = VisMF::BaseName(name);

            ++cnt[i];
        }
    }
#endif /*BL_USE_MPI*/


    } else {    // ---- calculate offsets

      auto whichRD = FArrayBox::getDataDescriptor();
      const FABio &fio = FArrayBox::getFABio();
      int whichRDBytes(whichRD->numBytes());
      int nComps(mf.nComp());

      if(myProc == coordinatorProc) {   // ---- calculate offsets
        const BoxArray &mfBA = mf.boxArray();
        const DistributionMapping &mfDM = mf.DistributionMap();
        Vector<Long> fabHeaderBytes(mfBA.size(), 0);
        int nFiles(NFilesIter::ActualNFiles(nOutFiles));
        int whichFileNumber(-1);
        std::string whichFileName;
        Vector<Long> currentOffset(nProcs, 0L);

        if(hdr.m_vers == VisMF::Header::Version_v1) {
          // ---- find the length of the fab header instead of asking the file system
          for(int i(0); i < mfBA.size(); ++i) {
            std::stringstream hss;
            FArrayBox tempFab(mf.fabbox(i), nComps, false);  // ---- no alloc
            fio.write_header(hss, tempFab, tempFab.nComp());
            fabHeaderBytes[i] = static_cast<std::streamoff>(hss.tellp());
          }
        }

        std::map<int, Vector<int> > rankBoxOrder;  // ---- [rank, boxarray index array]
        for(int i(0); i < mfBA.size(); ++i) {
          rankBoxOrder[mfDM[i]].push_back(i);
        }

        Vector<int> fileNumbers;
        if(nfi.GetDynamic()) {
          fileNumbers = nfi.FileNumbersWritten();
        }
        else if(nfi.GetSparseFPP()) {        // if sparse, write to (file number = rank)
          fileNumbers.resize(nProcs);
          for(int i(0); i < nProcs; ++i) {
            fileNumbers[i] = i;
          }
        }
        else {
          fileNumbers.resize(nProcs);
          for(int i(0); i < nProcs; ++i) {
            fileNumbers[i] = NFilesIter::FileNumber(nFiles, i, groupSets);
          }
        }

        const Vector< Vector<int> > &fileNumbersWriteOrder = nfi.FileNumbersWriteOrder();

        for(int fn(0); fn < fileNumbersWriteOrder.size(); ++fn) {
          for(int ri(0); ri < fileNumbersWriteOrder[fn].size(); ++ri) {
            int rank(fileNumbersWriteOrder[fn][ri]);
            std::map<int, Vector<int> >::iterator rboIter = rankBoxOrder.find(rank);

            if(rboIter != rankBoxOrder.end()) {
              Vector<int> &index = rboIter->second;
              whichFileNumber = fileNumbers[rank];
              whichFileName   = VisMF::BaseName(NFilesIter::FileName(whichFileNumber, filePrefix));

              for(int i(0); i < index.size(); ++i) {
                 hdr.m_fod[index[i]].m_name = whichFileName;
                 hdr.m_fod[index[i]].m_head = currentOffset[whichFileNumber];
                 currentOffset[whichFileNumber] += mf.fabbox(index[i]).numPts() * nComps * whichRDBytes
                                                   + fabHeaderBytes[index[i]];
              }
            }
          }
        }
      }
    }
}